

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

optional<unsigned_int> __thiscall
slang::ast::ConditionalExpression::getEffectiveWidthImpl(ConditionalExpression *this)

{
  Expression *pEVar1;
  optional<unsigned_int> __a;
  _Optional_payload_base<unsigned_int> *p_Var2;
  ConditionalExpression *in_RDI;
  Expression *branch;
  Expression *in_stack_ffffffffffffffc8;
  undefined8 local_8;
  
  pEVar1 = knownSide(in_RDI);
  if (pEVar1 == (Expression *)0x0) {
    left(in_RDI);
    Expression::getEffectiveWidth(in_stack_ffffffffffffffc8);
    right(in_RDI);
    __a = Expression::getEffectiveWidth(in_stack_ffffffffffffffc8);
    p_Var2 = (_Optional_payload_base<unsigned_int> *)
             std::max<std::optional<unsigned_int>>
                       ((optional<unsigned_int> *)
                        __a.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_int>,(optional<unsigned_int> *)in_RDI)
    ;
    local_8 = *p_Var2;
  }
  else {
    local_8 = (_Optional_payload_base<unsigned_int>)
              Expression::getEffectiveWidth(in_stack_ffffffffffffffc8);
  }
  return (optional<unsigned_int>)local_8;
}

Assistant:

std::optional<bitwidth_t> ConditionalExpression::getEffectiveWidthImpl() const {
    if (auto branch = knownSide())
        return branch->getEffectiveWidth();
    return std::max(left().getEffectiveWidth(), right().getEffectiveWidth());
}